

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsbox.cpp
# Opt level: O3

Error * libsbox::run_together
                  (Error *__return_storage_ptr__,
                  vector<libsbox::Task_*,_std::allocator<libsbox::Task_*>_> *tasks,
                  string *socket_path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  Task *this;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  Ch *__s;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ssize_t sVar7;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *pGVar8;
  char *pcVar9;
  Type pGVar10;
  long lVar11;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *value;
  Ch *pCVar12;
  size_t __n;
  ulong uVar13;
  undefined8 *puVar14;
  vector<libsbox::Task_*,_std::allocator<libsbox::Task_*>_> *__range1;
  fd_t socket_fd;
  string res;
  Document document;
  string message;
  char buf [1024];
  int local_5dc;
  string local_5d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_5b8;
  undefined8 local_5b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a8;
  Data local_598;
  long local_588 [8];
  ParseErrorCode local_548;
  undefined8 local_540;
  long *local_538;
  long local_530;
  long local_528 [2];
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  local_518;
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_4d8;
  string local_4a8 [32];
  undefined1 local_9e [18];
  undefined8 local_8c;
  undefined8 uStack_84;
  undefined8 local_7c;
  undefined8 uStack_74;
  undefined8 local_6c;
  undefined8 uStack_64;
  undefined8 local_5c;
  undefined8 uStack_54;
  undefined8 uStack_4c;
  undefined4 uStack_44;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined8 uStack_38;
  
  local_518.os_ = &local_4d8;
  local_4d8.stack_.stackEnd_ = (char *)0x0;
  local_4d8.stack_.stack_ = (char *)0x0;
  local_4d8.stack_.stackTop_ = (char *)0x0;
  local_4d8.stack_.allocator_ = (CrtAllocator *)0x0;
  local_4d8.stack_.ownAllocator_ = (CrtAllocator *)0x0;
  local_4d8.stack_.initialCapacity_ = 0x100;
  local_518.level_stack_.allocator_ = (CrtAllocator *)0x0;
  local_518.level_stack_.ownAllocator_ = (CrtAllocator *)0x0;
  local_518.level_stack_.stack_ = (char *)0x0;
  local_518.level_stack_.stackTop_ = (char *)0x0;
  local_518.level_stack_.stackEnd_ = (char *)0x0;
  local_518.level_stack_.initialCapacity_ = 0x200;
  local_518.maxDecimalPlaces_ = 0x144;
  local_518.hasRoot_ = false;
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartObject(&local_518);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(&local_518,"tasks",5,false);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray(&local_518);
  puVar14 = *(undefined8 **)tasks;
  puVar2 = *(undefined8 **)(tasks + 8);
  if (puVar14 != puVar2) {
    do {
      Task::
      serialize_request<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
                ((Task *)*puVar14,&local_518);
      puVar14 = puVar14 + 1;
    } while (puVar14 != puVar2);
  }
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndArray(&local_518,0);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndObject(&local_518,0);
  __s = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                  (&local_4d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_538,__s,(allocator<char> *)local_4a8);
  local_5dc = socket(1,1,0);
  if (local_5dc < 0) {
    format_abi_cxx11_(local_4a8,"Cannot create socket: %m");
    Error::Error(__return_storage_ptr__,local_4a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8[0]._M_dataplus._M_p != &local_4a8[0].field_2) {
      operator_delete(local_4a8[0]._M_dataplus._M_p,local_4a8[0].field_2._M_allocated_capacity + 1);
    }
    goto LAB_00132e2f;
  }
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_00160210;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)&local_5dc;
  uStack_3c = 0;
  uStack_38 = 0;
  uStack_4c = 0;
  uStack_44 = 0;
  local_40 = 0;
  local_5c = 0;
  uStack_54 = 0;
  local_6c = 0;
  uStack_64 = 0;
  local_7c = 0;
  uStack_74 = 0;
  local_8c = 0;
  uStack_84 = 0;
  local_9e[2] = '\0';
  local_9e[3] = '\0';
  local_9e[4] = '\0';
  local_9e[5] = '\0';
  local_9e[6] = '\0';
  local_9e[7] = '\0';
  local_9e[8] = '\0';
  local_9e[9] = '\0';
  local_9e._10_8_ = 0;
  local_9e._0_2_ = 1;
  __n = 0x6b;
  if (socket_path->_M_string_length < 0x6b) {
    __n = socket_path->_M_string_length;
  }
  strncpy(local_9e + 2,(socket_path->_M_dataplus)._M_p,__n);
  iVar5 = connect(local_5dc,(sockaddr *)local_9e,0x6e);
  if (iVar5 == 0) {
    sVar7 = send(local_5dc,local_538,local_530 + 1,0);
    if ((-1 < (int)(uint)sVar7) && ((ulong)((uint)sVar7 & 0x7fffffff) == local_530 + 1U)) {
      local_5b8 = &local_5a8;
      local_5b0 = 0;
      local_5a8._M_local_buf[0] = '\0';
      while( true ) {
        sVar7 = recv(local_5dc,local_4a8,0x3ff,0);
        uVar6 = (uint)sVar7;
        if ((int)uVar6 < 0) break;
        if (uVar6 == 0) {
          if ((run_together(std::vector<libsbox::Task*,std::allocator<libsbox::Task*>>const&,std::__cxx11::string_const&)
               ::response_validator == '\0') &&
             (iVar5 = __cxa_guard_acquire(&run_together(std::vector<libsbox::Task*,std::allocator<libsbox::Task*>>const&,std::__cxx11::string_const&)
                                           ::response_validator), iVar5 != 0)) {
            SchemaValidator::SchemaValidator(&run_together::response_validator,response_schema_data)
            ;
            __cxa_atexit(SchemaValidator::~SchemaValidator,&run_together::response_validator,
                         &__dso_handle);
            __cxa_guard_release(&run_together(std::vector<libsbox::Task*,std::allocator<libsbox::Task*>>const&,std::__cxx11::string_const&)
                                 ::response_validator);
          }
          SchemaValidator::get_error_abi_cxx11_
                    ((string *)&local_598.s,&run_together::response_validator);
          if (local_598.n.i64 != (Number)local_588) {
            operator_delete((void *)local_598.n,local_588[0] + 1);
          }
          if (local_598.s.str != (Ch *)0x0) {
            SchemaValidator::get_error_abi_cxx11_
                      ((string *)&local_598.s,&run_together::response_validator);
            Error::Error(__return_storage_ptr__,(string *)&local_598.s);
            if (local_598.n.i64 == (Number)local_588) goto LAB_0013311e;
            goto LAB_00132f47;
          }
          rapidjson::
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                             *)&local_598.s,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,
                            0x400,(CrtAllocator *)0x0);
          local_5d8._M_dataplus._M_p = (pointer)local_5b8;
          local_5d8._M_string_length = (size_type)local_5b8;
          pGVar8 = rapidjson::
                   GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                   ::
                   ParseStream<0u,rapidjson::UTF8<char>,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                             ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                               *)&local_598.s,
                              (GenericStringStream<rapidjson::UTF8<char>_> *)&local_5d8);
          if ((pGVar8->parseResult_).code_ == kParseErrorNone) {
            bVar4 = SchemaValidator::validate
                              (&run_together::response_validator,(Document *)&local_598.s);
            if (!bVar4) {
              SchemaValidator::get_error_abi_cxx11_(&local_5d8,&run_together::response_validator);
              Error::Error(__return_storage_ptr__,&local_5d8);
              goto LAB_001330f4;
            }
            bVar4 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                 *)&local_598.s,"error");
            if ((bVar4) &&
               (pGVar10 = rapidjson::
                          GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          ::operator[]<char_const>
                                    ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                      *)&local_598.s,"error"),
               (undefined1  [16])
               ((undefined1  [16])pGVar10->data_ & (undefined1  [16])0x400000000000000) !=
               (undefined1  [16])0x0)) {
              pGVar10 = rapidjson::
                        GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ::operator[]<char_const>
                                  ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                    *)&local_598.s,"error");
              pCVar12 = rapidjson::
                        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ::GetString(pGVar10);
              format_abi_cxx11_(&local_5d8,"[remote] %s",pCVar12);
              Error::Error(__return_storage_ptr__,&local_5d8);
              goto LAB_001330f4;
            }
            pGVar10 = rapidjson::
                      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      ::operator[]<char_const>
                                ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                  *)&local_598.s,"tasks");
            if ((pGVar10->data_).f.flags != 4) {
              __assert_fail("IsArray()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                            ,0x711,
                            "Array rapidjson::GenericValue<rapidjson::UTF8<>>::GetArray() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                           );
            }
            lVar11 = *(long *)tasks;
            if (*(long *)(tasks + 8) - lVar11 >> 3 == (ulong)(pGVar10->data_).s.length) {
              if (*(long *)(tasks + 8) == lVar11) goto LAB_001330bd;
              paVar1 = &(__return_storage_ptr__->error_).field_2;
              uVar13 = 0;
              goto LAB_00133059;
            }
            local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_5d8,
                       "Response JSON object \'tasks\' array size is not equal to tasks count","");
            Error::Error(__return_storage_ptr__,&local_5d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5d8._M_dataplus._M_p == &local_5d8.field_2) goto LAB_0013310f;
          }
          else {
            pcVar9 = rapidjson::GetParseError_En(local_548);
            format_abi_cxx11_(&local_5d8,"Cannot parse response (offset %zi): %s",local_540,pcVar9);
            Error::Error(__return_storage_ptr__,&local_5d8);
LAB_001330f4:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5d8._M_dataplus._M_p == &local_5d8.field_2) goto LAB_0013310f;
          }
          operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
          goto LAB_0013310f;
        }
        *(undefined1 *)((long)&local_4a8[0]._M_dataplus._M_p + (ulong)(uVar6 & 0x7fffffff)) = 0;
        std::__cxx11::string::append((char *)&local_5b8);
      }
      format_abi_cxx11_((string *)&local_598.s,"Cannot receive response: %m");
      Error::Error(__return_storage_ptr__,(string *)&local_598.s);
      if (local_598.n.i64 != (Number)local_588) {
LAB_00132f47:
        operator_delete((void *)local_598.n,local_588[0] + 1);
      }
      goto LAB_0013311e;
    }
    format_abi_cxx11_(local_4a8,"Cannot send request: %m");
    Error::Error(__return_storage_ptr__,local_4a8);
  }
  else {
    format_abi_cxx11_(local_4a8,"Cannot connect to socket: %m");
    Error::Error(__return_storage_ptr__,local_4a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8[0]._M_dataplus._M_p != &local_4a8[0].field_2) {
LAB_00132e1f:
    operator_delete(local_4a8[0]._M_dataplus._M_p,local_4a8[0].field_2._0_8_ + 1);
  }
  goto LAB_00132e27;
  while( true ) {
    pcVar3 = (__return_storage_ptr__->error_)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    uVar13 = uVar13 + 1;
    lVar11 = *(long *)tasks;
    if ((ulong)(*(long *)(tasks + 8) - lVar11 >> 3) <= uVar13) break;
LAB_00133059:
    this = *(Task **)(lVar11 + uVar13 * 8);
    pGVar10 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>
                        ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)&local_598.s,"tasks");
    value = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::operator[](pGVar10,(SizeType)uVar13);
    Task::
    deserialize_response<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              (__return_storage_ptr__,this,value);
    bVar4 = Error::operator_cast_to_bool(__return_storage_ptr__);
    if (bVar4) goto LAB_0013310f;
  }
LAB_001330bd:
  (__return_storage_ptr__->error_).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->error_).field_2 + 8) = 0;
  (__return_storage_ptr__->error_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error_).field_2;
  (__return_storage_ptr__->error_)._M_string_length = 0;
LAB_0013310f:
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)&local_598.s);
LAB_0013311e:
  if (local_5b8 != &local_5a8) {
    local_4a8[0].field_2._0_8_ =
         CONCAT71(local_5a8._M_allocated_capacity._1_7_,local_5a8._M_local_buf[0]);
    local_4a8[0]._M_dataplus._M_p = (pointer)local_5b8;
    goto LAB_00132e1f;
  }
LAB_00132e27:
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
LAB_00132e2f:
  if (local_538 != local_528) {
    operator_delete(local_538,local_528[0] + 1);
  }
  free(local_518.level_stack_.stack_);
  operator_delete(local_518.level_stack_.ownAllocator_,1);
  free(local_4d8.stack_.stack_);
  operator_delete(local_4d8.stack_.ownAllocator_,1);
  return __return_storage_ptr__;
}

Assistant:

Error libsbox::run_together(const std::vector<Task *> &tasks, const std::string &socket_path) {
    rapidjson::StringBuffer buffer;
    rapidjson::Writer<rapidjson::StringBuffer> writer(buffer);
    writer.StartObject();
    writer.Key("tasks");
    writer.StartArray();
    for (auto task : tasks) {
        task->serialize_request(writer);
    }
    writer.EndArray();
    writer.EndObject();

    std::string message = buffer.GetString();

    fd_t socket_fd = socket(AF_UNIX, SOCK_STREAM, 0);
    if (socket_fd < 0) {
        return Error(format("Cannot create socket: %m"));
    }

    std::shared_ptr<fd_t> ptr(&socket_fd, [](const fd_t *fd) { close(*fd); });

    sockaddr_un addr{};
    addr.sun_family = AF_UNIX;
    strncpy(addr.sun_path, socket_path.c_str(), std::min(sizeof(addr.sun_path) - 1, socket_path.size()));

    int status = connect(socket_fd, reinterpret_cast<const struct sockaddr *>(&addr), sizeof(struct sockaddr_un));
    if (status != 0) {
        return Error(format("Cannot connect to socket: %m"));
    }

    int cnt = send(socket_fd, message.c_str(), message.size() + 1, 0);
    if (cnt < 0 || static_cast<size_t>(cnt) != message.size() + 1) {
        return Error(format("Cannot send request: %m"));
    }

    std::string res;
    char buf[1024];
    while (true) {
        cnt = recv(socket_fd, buf, 1023, 0);
        if (cnt < 0) {
            return Error(format("Cannot receive response: %m"));
        }
        if (cnt == 0) {
            break;
        }
        buf[cnt] = 0;
        res += buf;
    }

    static SchemaValidator response_validator(response_schema_data);
    if (!response_validator.get_error().empty()) {
        return Error(response_validator.get_error());
    }

    rapidjson::Document document;
    if (document.Parse(res.c_str()).HasParseError()) {
        return Error(
            format(
                "Cannot parse response (offset %zi): %s",
                document.GetErrorOffset(),
                rapidjson::GetParseError_En(document.GetParseError())
            )
        );
    }

    if (!response_validator.validate(document)) {
        return Error(response_validator.get_error());
    }

    if (document.HasMember("error") && document["error"].IsString()) {
        return Error(format("[remote] %s", document["error"].GetString()));
    }

    if (document["tasks"].GetArray().Size() != tasks.size()) {
        return Error("Response JSON object 'tasks' array size is not equal to tasks count");
    }

    for (size_t i = 0; i < tasks.size(); ++i) {
        auto error = tasks[i]->deserialize_response(document["tasks"][i]);
        if (error) {
            return error;
        }
    }

    return Error();
}